

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::setTimeProperty
          (CommonCore *this,LocalFederateId federateID,int32_t property,Time time)

{
  string_view message;
  string_view message_00;
  bool bVar1;
  FederateState *pFVar2;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  char *__str;
  ActionMessage cmd;
  FederateState *fed;
  ActionMessage *this_01;
  char *in_stack_fffffffffffffed8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  action_t in_stack_fffffffffffffeec;
  FederateState *in_stack_fffffffffffffef0;
  CommonCore *in_stack_ffffffffffffff08;
  LocalFederateId in_stack_ffffffffffffff14;
  TimeRepresentation<count_time<9,_long>_> local_10 [2];
  
  pFVar2 = getFederateAt(in_stack_ffffffffffffff08,in_stack_ffffffffffffff14);
  if (pFVar2 == (FederateState *)0x0) {
    this_00 = (basic_string_view<char,_std::char_traits<char>_> *)__cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (this_00,in_stack_fffffffffffffed8);
    message._M_len._4_4_ = in_stack_fffffffffffffeec;
    message._M_len._0_4_ = in_stack_fffffffffffffee8;
    message._M_str = (char *)in_stack_fffffffffffffef0;
    InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)this_00,message);
    __cxa_throw(this_00,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
  }
  bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                    (local_10,(TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
  if (!bVar1) {
    this_01 = (ActionMessage *)&stack0xfffffffffffffef8;
    ActionMessage::ActionMessage
              ((ActionMessage *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    FederateState::setProperties
              (in_stack_fffffffffffffef0,
               (ActionMessage *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    ActionMessage::~ActionMessage(this_01);
    return;
  }
  __str = (char *)__cxa_allocate_exception(0x28);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffee0,__str);
  message_00._M_len._4_4_ = in_stack_fffffffffffffeec;
  message_00._M_len._0_4_ = in_stack_fffffffffffffee8;
  message_00._M_str = (char *)in_stack_fffffffffffffef0;
  InvalidParameter::InvalidParameter((InvalidParameter *)in_stack_fffffffffffffee0,message_00);
  __cxa_throw(__str,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
}

Assistant:

void CommonCore::setTimeProperty(LocalFederateId federateID, int32_t property, Time time)
{
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid (setTimeDelta)"));
    }
    if (time < timeZero) {
        throw(InvalidParameter("time properties must be greater than or equal to zero"));
    }

    ActionMessage cmd(CMD_FED_CONFIGURE_TIME);
    cmd.messageID = property;
    cmd.actionTime = time;
    fed->setProperties(cmd);
}